

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu34x.c
# Opt level: O1

MPP_RET hal_vp9d_vdpu34x_flush(void *hal)

{
  long lVar1;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (((byte)hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_vdpu34x","(%d) enter\n","hal_vp9d_vdpu34x_flush",0x41c);
  }
  *(undefined8 *)(lVar1 + 0xf0) = 0xffffffffffffffff;
  if (((byte)hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_vdpu34x","(%d) leave\n","hal_vp9d_vdpu34x_flush",0x421);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp9d_vdpu34x_flush(void *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu34xVp9dCtx *hw_ctx = (Vdpu34xVp9dCtx*)p_hal->hw_ctx;

    hal_vp9d_enter();

    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;

    hal_vp9d_leave();

    return MPP_OK;
}